

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::declaration_t::declaration_t
          (declaration_t *this,attributes_t *attr,string *context)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>_>_>
  local_20;
  
  this->_vptr_declaration_t = (_func_int **)&PTR__inner_declaration_t_0027cdd8;
  local_20._M_h = (__hashtable_alloc *)&this->_attr;
  (this->_attr)._attr._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_attr)._attr._M_h._M_bucket_count = (attr->_attr)._M_h._M_bucket_count;
  (this->_attr)._attr._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_attr)._attr._M_h._M_element_count = (attr->_attr)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(attr->_attr)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (attr->_attr)._M_h._M_rehash_policy._M_next_resize;
  (this->_attr)._attr._M_h._M_rehash_policy._M_max_load_factor =
       (attr->_attr)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->_attr)._attr._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->_attr)._attr._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->_attr)._attr._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<tchecker::parsing::attr_t>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)local_20._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
              *)attr,&local_20);
  (this->_context)._M_dataplus._M_p = (pointer)&(this->_context).field_2;
  pcVar1 = (context->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_context,pcVar1,pcVar1 + context->_M_string_length);
  return;
}

Assistant:

declaration_t::declaration_t(tchecker::parsing::attributes_t const & attr, std::string const & context)
    : _attr(attr), _context(context)
{
}